

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_global.h
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
lf::mesh::utils::
MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/fisher_kpp/strangsplitting_main.cc:159:18)>
::operator()(vector<double,_std::allocator<double>_> *__return_storage_ptr__,
            MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_fisher_kpp_strangsplitting_main_cc:159:18)>
            *this,Entity *e,MatrixXd *local)

{
  pointer pcVar1;
  _func_int **pp_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ScalarReferenceFiniteElement<double> *fe;
  iterator __position;
  _func_int *p_Var5;
  undefined8 uVar6;
  DofHandler *pDVar7;
  char cVar8;
  RefElType type;
  int iVar9;
  dim_t dVar10;
  size_type sVar11;
  undefined4 extraout_var;
  undefined8 *puVar12;
  undefined4 extraout_var_00;
  long *plVar13;
  QuadRule *pQVar14;
  long *plVar15;
  CoeffReturnType pdVar16;
  Matrix<double,__1,__1,_0,__1,__1> *xpr;
  Scalar *pSVar17;
  vector<double,_std::allocator<double>_> *extraout_RAX;
  ostream *poVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  Index i;
  ActualDstType actualDst;
  string *this_01;
  PointerType ptr;
  double __tmp;
  double dVar22;
  undefined1 auVar23 [16];
  double dVar24;
  undefined1 auVar25 [16];
  int iVar28;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  MatrixXd global_points_1;
  ElemVec elem_vec;
  VectorXd L1;
  vector<double,_std::allocator<double>_> g_vals;
  VectorXd determinants;
  shared_ptr<const_lf::mesh::Mesh> mesh;
  MatrixXd mapped_qpts;
  MatrixXd global_points;
  stringstream ss;
  string local_418;
  string local_3f8;
  undefined1 local_3d8 [32];
  double *local_3b8;
  assign_op<double,_double> local_399;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_398;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_fisher_kpp_strangsplitting_main_cc:159:18)>
  *local_380;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_368;
  undefined8 uStack_360;
  vector<double,_std::allocator<double>_> local_358;
  vector<double,_std::allocator<double>_> *local_338;
  long *local_330;
  uint local_324;
  void *local_320;
  ulong local_318;
  long *local_310;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_308;
  string local_300;
  PrecomputedScalarReferenceFiniteElement<double> local_2e0;
  undefined1 local_270 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260 [2];
  PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_238;
  MatrixXd *local_220;
  Index local_218;
  DofHandler *local_210;
  undefined8 *local_208;
  undefined8 *local_200;
  long local_1f8;
  double local_1f0;
  void *local_1e8 [2];
  ulong local_1d8;
  Matrix<double,__1,__1,_0,__1,__1> local_1d0;
  undefined1 local_1b8 [72];
  double local_170;
  
  local_380 = this;
  iVar9 = (*e->_vptr_Entity[4])(e);
  dVar10 = base::internal::DimensionImpl((RefElType)iVar9);
  if ((local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows !=
      (ulong)dVar10) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),"mismatch between entity dimension and local.rows()",
               0x32);
    paVar3 = &local_300.field_2;
    local_300._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_300,"e.RefEl().Dimension() == local.rows()","");
    pcVar1 = local_3d8 + 0x10;
    local_3d8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3d8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_global.h"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_300,(string *)local_3d8,0x50,(string *)local_270);
    if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
      operator_delete((void *)local_270._0_8_,local_260[0]._M_allocated_capacity + 1);
    }
    if ((pointer)local_3d8._0_8_ != pcVar1) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT26(local_3d8._22_2_,
                               CONCAT15(local_3d8[0x15],CONCAT14(local_3d8[0x14],local_3d8._16_4_)))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != paVar3) {
      operator_delete(local_300._M_dataplus._M_p,
                      (ulong)(local_300.field_2._M_allocated_capacity + 1));
    }
    local_300._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"false","");
    local_3d8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3d8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_global.h"
               ,"");
    local_270._0_8_ = local_270 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"");
    base::AssertionFailed(&local_300,(string *)local_3d8,0x50,(string *)local_270);
    std::__cxx11::string::~string((string *)local_270);
    std::__cxx11::string::~string((string *)local_3d8);
    this_01 = &local_300;
LAB_00124885:
    std::__cxx11::string::~string((string *)this_01);
    abort();
  }
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_338 = __return_storage_ptr__;
  std::vector<double,_std::allocator<double>_>::reserve
            (__return_storage_ptr__,
             (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_cols);
  iVar9 = (*e->_vptr_Entity[3])(e);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar9) + 0x18))
            (&local_1d0,(long *)CONCAT44(extraout_var,iVar9),local);
  local_220 = local;
  if (0 < (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
     ) {
    i = 0;
    do {
      local_218 = i;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_270,
                 &local_1d0,i);
      Eigen::PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::resize
                (&local_238,local_270._8_8_,1);
      uVar6 = local_270._0_8_;
      Eigen::internal::
      resize_if_allowed<Eigen::Matrix<double,2,1,0,2,1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,double,double>
                ((Matrix<double,_2,_1,_0,_2,_1> *)&local_238,
                 (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_270,
                 (assign_op<double,_double> *)local_1b8);
      local_238.m_storage.m_data.array[0] = *(double *)uVar6;
      local_238.m_storage.m_data.array[1] = *(PointerType)(uVar6 + 8);
      local_378.m_storage.m_data = (double *)0x0;
      local_378.m_storage.m_rows = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&local_378,(ulong)(local_380->f_).N_dofs);
      local_300._M_dataplus._M_p = (pointer)0x0;
      Eigen::
      CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
      ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)local_1b8,local_378.m_storage.m_rows,1,
                       (scalar_constant_op<double> *)&local_300);
      Eigen::internal::
      resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>,double,double>
                ((Matrix<double,__1,_1,_0,__1,_1> *)&local_378,
                 (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)local_1b8,(assign_op<double,_double> *)&local_300);
      if (0 < local_378.m_storage.m_rows) {
        uVar19 = local_378.m_storage.m_rows + 0x1fffffffffffffffU & 0x1fffffffffffffff;
        auVar34._8_4_ = (int)uVar19;
        auVar34._0_8_ = uVar19;
        auVar34._12_4_ = (int)(uVar19 >> 0x20);
        lVar20 = 0;
        do {
          auVar25._8_4_ = (int)lVar20;
          auVar25._0_8_ = lVar20;
          auVar25._12_4_ = (int)((ulong)lVar20 >> 0x20);
          auVar29 = auVar34 ^ _DAT_003d2020;
          auVar25 = (auVar25 | _DAT_003d2010) ^ _DAT_003d2020;
          auVar32._0_4_ = -(uint)(auVar29._0_4_ < auVar25._0_4_);
          auVar32._4_4_ = -(uint)(auVar29._4_4_ < auVar25._4_4_);
          auVar32._8_4_ = -(uint)(auVar29._8_4_ < auVar25._8_4_);
          auVar32._12_4_ = -(uint)(auVar29._12_4_ < auVar25._12_4_);
          iVar9 = -(uint)(auVar25._4_4_ == auVar29._4_4_);
          iVar28 = -(uint)(auVar25._12_4_ == auVar29._12_4_);
          auVar30._4_4_ = iVar9;
          auVar30._0_4_ = iVar9;
          auVar30._8_4_ = iVar28;
          auVar30._12_4_ = iVar28;
          auVar29._4_4_ = auVar32._4_4_;
          auVar29._0_4_ = auVar32._4_4_;
          auVar29._8_4_ = auVar32._12_4_;
          auVar29._12_4_ = auVar32._12_4_;
          auVar29 = auVar29 | auVar30 & auVar32;
          if ((~auVar29._0_4_ & 1) != 0) {
            local_378.m_storage.m_data[lVar20] = (double)local_1b8._16_8_;
          }
          if (((auVar29 ^ _DAT_003d20c0) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_378.m_storage.m_data[lVar20 + 1] = (double)local_1b8._16_8_;
          }
          lVar20 = lVar20 + 2;
        } while ((uVar19 - ((uint)(local_378.m_storage.m_rows + 0x1fffffffffffffffU) & 1)) + 2 !=
                 lVar20);
      }
      peVar4 = (local_380->f_).fe_space.
               super___shared_ptr<lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      this_00 = (local_380->f_).fe_space.
                super___shared_ptr<lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      local_300.field_2._8_8_ = (local_380->f_).edge_pred.bd_flags_edge;
      local_300._M_dataplus._M_p = (pointer)&PTR_isActive_004a3da8;
      local_300._M_string_length = (size_type)&PTR__MeshFunctionGlobal_004a3d78;
      local_300.field_2._M_allocated_capacity = (size_type)&local_238;
      local_2e0.grad_shape_fun_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
      m_storage.m_rows = 0;
      local_2e0.grad_shape_fun_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
      m_storage.m_cols = 0;
      local_2e0.shap_fun_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
      .m_cols = 0;
      local_2e0.grad_shape_fun_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
      m_storage.m_data = (double *)0x0;
      local_2e0.shap_fun_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
      .m_data = (double *)0x0;
      local_2e0.shap_fun_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
      .m_rows = 0;
      local_2e0.qr_.weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_data = (double *)0x0;
      local_2e0.qr_.weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_rows = 0;
      local_2e0.qr_.points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
      m_storage.m_rows = 0;
      local_2e0.qr_.points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
      m_storage.m_cols = 0;
      local_2e0.qr_.ref_el_.type_ = 0;
      local_2e0.qr_._1_3_ = 0;
      local_2e0.qr_.degree_ = 0;
      local_2e0.qr_.points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
      m_storage.m_data = (double *)0x0;
      local_2e0.super_ScalarReferenceFiniteElement<double>._vptr_ScalarReferenceFiniteElement =
           (_func_int **)&PTR__PrecomputedScalarReferenceFiniteElement_004a40d0;
      local_2e0.fe_ = (ScalarReferenceFiniteElement<double> *)0x0;
      quad::QuadRule::QuadRule(&local_2e0.qr_);
      local_2e0.grad_shape_fun_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
      m_storage.m_rows = 0;
      local_2e0.grad_shape_fun_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
      m_storage.m_cols = 0;
      local_2e0.shap_fun_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
      .m_cols = 0;
      local_2e0.grad_shape_fun_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
      m_storage.m_data = (double *)0x0;
      local_2e0.shap_fun_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
      .m_data = (double *)0x0;
      local_2e0.shap_fun_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
      .m_rows = 0;
      fe = (peVar4->rfs_edge_p_).
           super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      if (fe == (ScalarReferenceFiniteElement<double> *)0x0) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),"No shape functions specified for edges",0x26);
        pcVar1 = local_3d8 + 0x10;
        local_3d8._16_4_ = 0x21206566;
        local_3d8[0x14] = '=';
        local_3d8[0x15] = ' ';
        local_3d8._22_2_ = 0x756e;
        local_3d8._24_5_ = 0x7274706c6c;
        local_3d8._8_8_ = (double *)0xd;
        local_3d8[0x1d] = '\0';
        paVar3 = &local_418.field_2;
        local_418._M_dataplus._M_p = (pointer)paVar3;
        local_3d8._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_418,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed((string *)local_3d8,&local_418,0x333,&local_3f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,
                          CONCAT71(local_3f8.field_2._M_allocated_capacity._1_7_,
                                   local_3f8.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p != paVar3) {
          operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_3d8._0_8_ != pcVar1) {
          operator_delete((void *)local_3d8._0_8_,
                          CONCAT26(local_3d8._22_2_,
                                   CONCAT15(local_3d8[0x15],
                                            CONCAT14(local_3d8[0x14],local_3d8._16_4_))) + 1);
        }
        local_3d8._16_4_ = 0x736c6166;
        local_3d8[0x14] = 'e';
        local_3d8[0x15] = '\0';
        local_3d8._8_8_ = (double *)0x5;
        local_418._M_dataplus._M_p = (pointer)paVar3;
        local_3d8._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_418,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
                   ,"");
        local_3f8._M_string_length = 0;
        local_3f8.field_2._M_local_buf[0] = '\0';
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        base::AssertionFailed((string *)local_3d8,&local_418,0x333,&local_3f8);
LAB_0012486e:
        std::__cxx11::string::~string((string *)&local_3f8);
        std::__cxx11::string::~string((string *)&local_418);
        this_01 = (string *)local_3d8;
        goto LAB_00124885;
      }
      iVar9 = (*fe->_vptr_ScalarReferenceFiniteElement[3])(fe);
      quad::make_QuadRule((QuadRule *)local_3d8,(RefEl)0x2,iVar9 * 2);
      uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
      PrecomputedScalarReferenceFiniteElement
                ((PrecomputedScalarReferenceFiniteElement<double> *)local_1b8,fe,
                 (QuadRule *)local_3d8);
      uscalfe::PrecomputedScalarReferenceFiniteElement<double>::operator=
                (&local_2e0,(PrecomputedScalarReferenceFiniteElement<double> *)local_1b8);
      uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
      ~PrecomputedScalarReferenceFiniteElement
                ((PrecomputedScalarReferenceFiniteElement<double> *)local_1b8);
      free(local_3b8);
      free((void *)local_3d8._8_8_);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      local_210 = (local_380->f_).dofh;
      (*local_210->_vptr_DofHandler[8])(&local_310);
      auVar34 = (**(code **)(*local_310 + 0x10))(local_310,1);
      puVar12 = auVar34._0_8_;
      if (auVar34._8_8_ != 0) {
        local_208 = puVar12 + auVar34._8_8_;
        do {
          plVar15 = (long *)*puVar12;
          local_200 = puVar12;
          cVar8 = (**(code **)local_300._M_dataplus._M_p)(&local_300,plVar15);
          pDVar7 = local_210;
          if (cVar8 != '\0') {
            local_324 = (*local_210->_vptr_DofHandler[3])(local_210,plVar15);
            iVar9 = (*pDVar7->_vptr_DofHandler[5])(pDVar7,plVar15);
            local_1f8 = CONCAT44(extraout_var_00,iVar9);
            cVar8 = (**(code **)(*plVar15 + 0x20))(plVar15);
            if (cVar8 != '\x02') {
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1b8 + 0x10),"Edge must be of segment type",0x1c);
              pcVar1 = local_3d8 + 0x10;
              local_3d8._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_3d8,"ref_el == lf::base::RefEl::kSegment()","");
              paVar3 = &local_418.field_2;
              local_418._M_dataplus._M_p = (pointer)paVar3;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_418,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
                         ,"");
              std::__cxx11::stringbuf::str();
              base::AssertionFailed((string *)local_3d8,&local_418,0x37a,&local_3f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                operator_delete(local_3f8._M_dataplus._M_p,
                                CONCAT71(local_3f8.field_2._M_allocated_capacity._1_7_,
                                         local_3f8.field_2._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_418._M_dataplus._M_p != paVar3) {
                operator_delete(local_418._M_dataplus._M_p,
                                local_418.field_2._M_allocated_capacity + 1);
              }
              if ((pointer)local_3d8._0_8_ != pcVar1) {
                operator_delete((void *)local_3d8._0_8_,
                                CONCAT26(local_3d8._22_2_,
                                         CONCAT15(local_3d8[0x15],
                                                  CONCAT14(local_3d8[0x14],local_3d8._16_4_))) + 1);
              }
              local_3d8._16_4_ = 0x736c6166;
              local_3d8[0x14] = 'e';
              local_3d8[0x15] = '\0';
              local_3d8._8_8_ = (double *)0x5;
              local_418._M_dataplus._M_p = (pointer)paVar3;
              local_3d8._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_418,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
                         ,"");
              local_3f8._M_string_length = 0;
              local_3f8.field_2._M_local_buf[0] = '\0';
              local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
              base::AssertionFailed((string *)local_3d8,&local_418,0x37a,&local_3f8);
              goto LAB_0012486e;
            }
            plVar13 = (long *)(**(code **)(*plVar15 + 0x18))(plVar15);
            if (plVar13 == (long *)0x0) {
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1b8 + 0x10),"Invalid geometry!",0x11);
              pcVar1 = local_3d8 + 0x10;
              local_3d8._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_3d8,"geo_ptr != nullptr","");
              paVar3 = &local_418.field_2;
              local_418._M_dataplus._M_p = (pointer)paVar3;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_418,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
                         ,"");
              std::__cxx11::stringbuf::str();
              base::AssertionFailed((string *)local_3d8,&local_418,0x37d,&local_3f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                operator_delete(local_3f8._M_dataplus._M_p,
                                CONCAT71(local_3f8.field_2._M_allocated_capacity._1_7_,
                                         local_3f8.field_2._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_418._M_dataplus._M_p != paVar3) {
                operator_delete(local_418._M_dataplus._M_p,
                                local_418.field_2._M_allocated_capacity + 1);
              }
              if ((pointer)local_3d8._0_8_ != pcVar1) {
                operator_delete((void *)local_3d8._0_8_,
                                CONCAT26(local_3d8._22_2_,
                                         CONCAT15(local_3d8[0x15],
                                                  CONCAT14(local_3d8[0x14],local_3d8._16_4_))) + 1);
              }
              local_3d8._16_4_ = 0x736c6166;
              local_3d8[0x14] = 'e';
              local_3d8[0x15] = '\0';
              local_3d8._8_8_ = (double *)0x5;
              local_418._M_dataplus._M_p = (pointer)paVar3;
              local_3d8._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_418,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
                         ,"");
              local_3f8._M_string_length = 0;
              local_3f8.field_2._M_local_buf[0] = '\0';
              local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
              base::AssertionFailed((string *)local_3d8,&local_418,0x37d,&local_3f8);
              goto LAB_0012486e;
            }
            pQVar14 = uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(&local_2e0);
            (**(code **)(*plVar13 + 0x18))(local_1e8,plVar13,&pQVar14->points_);
            uVar19 = local_1d8;
            local_330 = plVar15;
            pQVar14 = uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(&local_2e0);
            if (uVar19 != (uint)(pQVar14->points_).
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_cols) {
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1b8 + 0x10),"Mismatch ",9);
              poVar18 = std::ostream::_M_insert<long>((long)(local_1b8 + 0x10));
              std::__ostream_insert<char,std::char_traits<char>>(poVar18," <-> ",5);
              uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(&local_2e0);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar18);
              pcVar1 = local_3d8 + 0x10;
              local_3d8._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_3d8,"mapped_qpts.cols() == pfe_.Qr().NumPoints()","");
              paVar3 = &local_418.field_2;
              local_418._M_dataplus._M_p = (pointer)paVar3;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_418,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
                         ,"");
              std::__cxx11::stringbuf::str();
              base::AssertionFailed((string *)local_3d8,&local_418,899,&local_3f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                operator_delete(local_3f8._M_dataplus._M_p,
                                CONCAT71(local_3f8.field_2._M_allocated_capacity._1_7_,
                                         local_3f8.field_2._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_418._M_dataplus._M_p != paVar3) {
                operator_delete(local_418._M_dataplus._M_p,
                                local_418.field_2._M_allocated_capacity + 1);
              }
              if ((pointer)local_3d8._0_8_ != pcVar1) {
                operator_delete((void *)local_3d8._0_8_,
                                CONCAT26(local_3d8._22_2_,
                                         CONCAT15(local_3d8[0x15],
                                                  CONCAT14(local_3d8[0x14],local_3d8._16_4_))) + 1);
              }
              local_3d8._16_4_ = 0x736c6166;
              local_3d8[0x14] = 'e';
              local_3d8[0x15] = '\0';
              local_3d8._8_8_ = (double *)0x5;
              local_418._M_dataplus._M_p = (pointer)paVar3;
              local_3d8._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_418,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
                         ,"");
              local_3f8._M_string_length = 0;
              local_3f8.field_2._M_local_buf[0] = '\0';
              local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
              base::AssertionFailed((string *)local_3d8,&local_418,899,&local_3f8);
              goto LAB_0012486e;
            }
            pQVar14 = uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(&local_2e0);
            (**(code **)(*plVar13 + 0x30))(&local_320,plVar13,&pQVar14->points_);
            uVar19 = local_318;
            pQVar14 = uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(&local_2e0);
            if (uVar19 != (uint)(pQVar14->points_).
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_cols) {
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1b8 + 0x10),"Mismatch ",9);
              poVar18 = std::ostream::_M_insert<long>((long)(local_1b8 + 0x10));
              std::__ostream_insert<char,std::char_traits<char>>(poVar18," <-> ",5);
              uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(&local_2e0);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar18);
              pcVar1 = local_3d8 + 0x10;
              local_3d8._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_3d8,"determinants.size() == pfe_.Qr().NumPoints()","");
              paVar3 = &local_418.field_2;
              local_418._M_dataplus._M_p = (pointer)paVar3;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_418,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
                         ,"");
              std::__cxx11::stringbuf::str();
              base::AssertionFailed((string *)local_3d8,&local_418,0x38a,&local_3f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                operator_delete(local_3f8._M_dataplus._M_p,
                                CONCAT71(local_3f8.field_2._M_allocated_capacity._1_7_,
                                         local_3f8.field_2._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_418._M_dataplus._M_p != paVar3) {
                operator_delete(local_418._M_dataplus._M_p,
                                local_418.field_2._M_allocated_capacity + 1);
              }
              if ((pointer)local_3d8._0_8_ != pcVar1) {
                operator_delete((void *)local_3d8._0_8_,
                                CONCAT26(local_3d8._22_2_,
                                         CONCAT15(local_3d8[0x15],
                                                  CONCAT14(local_3d8[0x14],local_3d8._16_4_))) + 1);
              }
              local_3d8._16_4_ = 0x736c6166;
              local_3d8[0x14] = 'e';
              local_3d8[0x15] = '\0';
              local_3d8._8_8_ = (double *)0x5;
              local_418._M_dataplus._M_p = (pointer)paVar3;
              local_3d8._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_418,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
                         ,"");
              local_3f8._M_string_length = 0;
              local_3f8.field_2._M_local_buf[0] = '\0';
              local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
              base::AssertionFailed((string *)local_3d8,&local_418,0x38a,&local_3f8);
              goto LAB_0012486e;
            }
            sVar11 = uscalfe::PrecomputedScalarReferenceFiniteElement<double>::NumRefShapeFunctions
                               (&local_2e0);
            local_398.m_storage.m_data = (double *)0x0;
            local_398.m_storage.m_rows = 0;
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&local_398,(ulong)sVar11);
            local_3d8._0_8_ = (pointer)0x0;
            Eigen::
            CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
            ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                              *)local_1b8,local_398.m_storage.m_rows,1,
                             (scalar_constant_op<double> *)local_3d8);
            Eigen::internal::
            resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>,double,double>
                      ((Matrix<double,__1,_1,_0,__1,_1> *)&local_398,
                       (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)local_1b8,(assign_op<double,_double> *)local_3d8);
            if (0 < local_398.m_storage.m_rows) {
              uVar19 = local_398.m_storage.m_rows + 0x1fffffffffffffffU & 0x1fffffffffffffff;
              auVar23._8_4_ = (int)uVar19;
              auVar23._0_8_ = uVar19;
              auVar23._12_4_ = (int)(uVar19 >> 0x20);
              lVar20 = 0;
              do {
                auVar26._8_4_ = (int)lVar20;
                auVar26._0_8_ = lVar20;
                auVar26._12_4_ = (int)((ulong)lVar20 >> 0x20);
                auVar25 = auVar23 ^ _DAT_003d2020;
                auVar34 = (auVar26 | _DAT_003d2010) ^ _DAT_003d2020;
                auVar33._0_4_ = -(uint)(auVar25._0_4_ < auVar34._0_4_);
                auVar33._4_4_ = -(uint)(auVar25._4_4_ < auVar34._4_4_);
                auVar33._8_4_ = -(uint)(auVar25._8_4_ < auVar34._8_4_);
                auVar33._12_4_ = -(uint)(auVar25._12_4_ < auVar34._12_4_);
                iVar9 = -(uint)(auVar34._4_4_ == auVar25._4_4_);
                iVar28 = -(uint)(auVar34._12_4_ == auVar25._12_4_);
                auVar31._4_4_ = iVar9;
                auVar31._0_4_ = iVar9;
                auVar31._8_4_ = iVar28;
                auVar31._12_4_ = iVar28;
                auVar27._4_4_ = auVar33._4_4_;
                auVar27._0_4_ = auVar33._4_4_;
                auVar27._8_4_ = auVar33._12_4_;
                auVar27._12_4_ = auVar33._12_4_;
                auVar27 = auVar27 | auVar31 & auVar33;
                if ((~auVar27._0_4_ & 1) != 0) {
                  local_398.m_storage.m_data[lVar20] = (double)local_1b8._16_8_;
                }
                if (((auVar27 ^ _DAT_003d20c0) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  local_398.m_storage.m_data[lVar20 + 1] = (double)local_1b8._16_8_;
                }
                lVar20 = lVar20 + 2;
              } while ((uVar19 - ((uint)(local_398.m_storage.m_rows + 0x1fffffffffffffffU) & 1)) + 2
                       != lVar20);
            }
            pQVar14 = uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(&local_2e0);
            type = (**(code **)(*local_330 + 0x20))();
            dVar10 = base::internal::DimensionImpl(type);
            if ((pQVar14->points_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows != (ulong)dVar10) {
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1b8 + 0x10),
                         "mismatch between entity dimension and local.rows()",0x32);
              pcVar1 = local_3d8 + 0x10;
              local_3d8._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_3d8,"e.RefEl().Dimension() == local.rows()","");
              paVar3 = &local_418.field_2;
              local_418._M_dataplus._M_p = (pointer)paVar3;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_418,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_global.h"
                         ,"");
              std::__cxx11::stringbuf::str();
              base::AssertionFailed((string *)local_3d8,&local_418,0x50,&local_3f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                operator_delete(local_3f8._M_dataplus._M_p,
                                CONCAT71(local_3f8.field_2._M_allocated_capacity._1_7_,
                                         local_3f8.field_2._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_418._M_dataplus._M_p != paVar3) {
                operator_delete(local_418._M_dataplus._M_p,
                                local_418.field_2._M_allocated_capacity + 1);
              }
              if ((pointer)local_3d8._0_8_ != pcVar1) {
                operator_delete((void *)local_3d8._0_8_,
                                CONCAT26(local_3d8._22_2_,
                                         CONCAT15(local_3d8[0x15],
                                                  CONCAT14(local_3d8[0x14],local_3d8._16_4_))) + 1);
              }
              local_3d8._16_4_ = 0x736c6166;
              local_3d8[0x14] = 'e';
              local_3d8[0x15] = '\0';
              local_3d8._8_8_ = (double *)0x5;
              local_418._M_dataplus._M_p = (pointer)paVar3;
              local_3d8._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_418,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_global.h"
                         ,"");
              local_3f8._M_string_length = 0;
              local_3f8.field_2._M_local_buf[0] = '\0';
              local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
              base::AssertionFailed((string *)local_3d8,&local_418,0x50,&local_3f8);
              goto LAB_0012486e;
            }
            local_358.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_358.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = (double *)0x0;
            local_358.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (double *)0x0;
            std::vector<double,_std::allocator<double>_>::reserve
                      (&local_358,
                       (pQVar14->points_).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_cols);
            plVar15 = (long *)(**(code **)(*local_330 + 0x18))();
            (**(code **)(*plVar15 + 0x18))((QuadRule *)local_3d8,plVar15,&pQVar14->points_);
            if (0 < (pQVar14->points_).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_cols) {
              lVar20 = 0;
              do {
                Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                          ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_1b8
                           ,(Matrix<double,__1,__1,_0,__1,__1> *)local_3d8,lVar20);
                Eigen::PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::resize
                          ((PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&local_418,
                           local_1b8._8_8_,1);
                uVar6 = local_1b8._0_8_;
                Eigen::internal::
                resize_if_allowed<Eigen::Matrix<double,2,1,0,2,1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,double,double>
                          ((Matrix<double,_2,_1,_0,_2,_1> *)&local_418,
                           (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_1b8
                           ,&local_399);
                local_418._M_dataplus._M_p = *(pointer *)uVar6;
                local_418._M_string_length = *(size_type *)(uVar6 + 8);
                dVar24 = *(double *)(local_300.field_2._M_allocated_capacity + 8) -
                         (double)local_418._M_string_length;
                dVar24 = dVar24 * dVar24 +
                         (*(double *)local_300.field_2._M_allocated_capacity -
                         (double)local_418._M_dataplus._M_p) *
                         (*(double *)local_300.field_2._M_allocated_capacity -
                         (double)local_418._M_dataplus._M_p);
                dVar22 = SQRT(dVar24);
                local_3f8._M_dataplus._M_p =
                     (pointer)(~-(ulong)(dVar22 < 5.0) &
                              ~-(ulong)(30.0 < dVar22) & (ulong)(1.0 / (dVar24 + 1.0)));
                if (local_358.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_358.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                            (&local_358,
                             (iterator)
                             local_358.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish,(double *)&local_3f8);
                }
                else {
                  *local_358.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish = (double)local_3f8._M_dataplus._M_p;
                  local_358.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_358.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                lVar20 = lVar20 + 1;
              } while (lVar20 < (pQVar14->points_).
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_cols);
            }
            free((void *)local_3d8._0_8_);
            uVar19 = 0;
            while( true ) {
              pQVar14 = uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(&local_2e0);
              if ((uint)(pQVar14->points_).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_cols <= uVar19) break;
              pQVar14 = uscalfe::PrecomputedScalarReferenceFiniteElement<double>::Qr(&local_2e0);
              pdVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                        operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                                   &pQVar14->weights_,uVar19);
              local_368 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*pdVar16;
              pdVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                        operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                                   &local_320,uVar19);
              local_368 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((double)local_368 * *pdVar16 *
                             local_358.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar19]);
              xpr = uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
                    PrecompReferenceShapeFunctions(&local_2e0);
              Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                        ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
                         local_3d8,xpr,uVar19);
              local_3f8._M_dataplus._M_p = (pointer)local_368;
              Eigen::
              CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
              ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                *)&local_418,local_3d8._8_8_,1,
                               (scalar_constant_op<double> *)&local_3f8);
              Eigen::
              CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               *)local_1b8,(Lhs *)local_3d8,(Rhs *)&local_418,
                              (scalar_product_op<double,_double> *)&local_399);
              uVar6 = local_1b8._0_8_;
              local_368 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_170;
              uStack_360 = 0;
              Eigen::internal::
              resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>,Eigen::internal::add_assign_op<double,double>>
                        ((Matrix<double,__1,_1,_0,__1,_1> *)&local_398,
                         (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          *)local_1b8,(add_assign_op<double,_double> *)&local_418);
              uVar21 = local_398.m_storage.m_rows - (local_398.m_storage.m_rows >> 0x3f) &
                       0xfffffffffffffffe;
              if (1 < local_398.m_storage.m_rows) {
                lVar20 = 0;
                do {
                  pp_Var2 = (_func_int **)(uVar6 + lVar20 * 8);
                  p_Var5 = pp_Var2[1];
                  dVar24 = (local_398.m_storage.m_data + lVar20)[1];
                  local_398.m_storage.m_data[lVar20] =
                       (double)*pp_Var2 * (double)local_368 + local_398.m_storage.m_data[lVar20];
                  (local_398.m_storage.m_data + lVar20)[1] =
                       (double)p_Var5 * (double)local_368 + dVar24;
                  lVar20 = lVar20 + 2;
                } while (lVar20 < (long)uVar21);
              }
              if ((long)uVar21 < local_398.m_storage.m_rows) {
                do {
                  local_398.m_storage.m_data[uVar21] =
                       (double)*(_func_int **)(uVar6 + uVar21 * 8) * (double)local_368 +
                       local_398.m_storage.m_data[uVar21];
                  uVar21 = uVar21 + 1;
                } while (local_398.m_storage.m_rows != uVar21);
              }
              uVar19 = uVar19 + 1;
            }
            if (local_358.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_358.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_358.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_358.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            free(local_320);
            free(local_1e8[0]);
            uVar19 = (ulong)local_324;
            if (local_398.m_storage.m_rows < (long)uVar19) {
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1b8 + 0x10),"length mismatch ",0x10);
              poVar18 = std::ostream::_M_insert<long>((long)(local_1b8 + 0x10));
              std::__ostream_insert<char,std::char_traits<char>>(poVar18," <-> ",5);
              poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)poVar18);
              std::__ostream_insert<char,std::char_traits<char>>(poVar18,", entity ",9);
              (**(code **)(*local_310 + 0x28))(local_310,local_330);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar18);
              pcVar1 = local_3d8 + 0x10;
              local_3d8._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_3d8,"elem_vec.size() >= veclen","");
              paVar3 = &local_418.field_2;
              local_418._M_dataplus._M_p = (pointer)paVar3;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_418,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/assembler.h"
                         ,"");
              std::__cxx11::stringbuf::str();
              base::AssertionFailed((string *)local_3d8,&local_418,0x140,&local_3f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                operator_delete(local_3f8._M_dataplus._M_p,
                                CONCAT71(local_3f8.field_2._M_allocated_capacity._1_7_,
                                         local_3f8.field_2._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_418._M_dataplus._M_p != paVar3) {
                operator_delete(local_418._M_dataplus._M_p,
                                local_418.field_2._M_allocated_capacity + 1);
              }
              if ((pointer)local_3d8._0_8_ != pcVar1) {
                operator_delete((void *)local_3d8._0_8_,
                                CONCAT26(local_3d8._22_2_,
                                         CONCAT15(local_3d8[0x15],
                                                  CONCAT14(local_3d8[0x14],local_3d8._16_4_))) + 1);
              }
              local_3d8._16_4_ = 0x736c6166;
              local_3d8[0x14] = 'e';
              local_3d8[0x15] = '\0';
              local_3d8._8_8_ = (double *)0x5;
              local_418._M_dataplus._M_p = (pointer)paVar3;
              local_3d8._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_418,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/assembler.h"
                         ,"");
              local_3f8._M_string_length = 0;
              local_3f8.field_2._M_local_buf[0] = '\0';
              local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
              base::AssertionFailed((string *)local_3d8,&local_418,0x140,&local_3f8);
              goto LAB_0012486e;
            }
            if (local_324 != 0) {
              uVar21 = 0;
              do {
                pdVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                          operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                                     &local_398,uVar21);
                local_368 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*pdVar16;
                pSVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::
                          operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                                     &local_378,*(Index *)(local_1f8 + uVar21 * 8));
                *pSVar17 = (double)local_368 + *pSVar17;
                uVar21 = uVar21 + 1;
              } while (uVar19 != uVar21);
            }
            free(local_398.m_storage.m_data);
          }
          puVar12 = local_200 + 1;
        } while (puVar12 != local_208);
      }
      if (local_308 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_308);
      }
      pSVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_378,
                           (long)(local_380->f_).j);
      local_368 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*pSVar17;
      local_300._M_dataplus._M_p = (pointer)&PTR_isActive_004a3da8;
      uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
      ~PrecomputedScalarReferenceFiniteElement(&local_2e0);
      free(local_378.m_storage.m_data);
      local_1f0 = (double)local_368;
      __position._M_current =
           (local_338->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (local_338->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (local_338,__position,&local_1f0);
      }
      else {
        *__position._M_current = (double)local_368;
        (local_338->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      i = local_218 + 1;
    } while (i < (local_220->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_cols);
  }
  free(local_1d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return extraout_RAX;
}

Assistant:

std::vector<F_return_type> operator()(const mesh::Entity& e,
                                        const Eigen::MatrixXd& local) const {
    LF_ASSERT_MSG(e.RefEl().Dimension() == local.rows(),
                  "mismatch between entity dimension and local.rows()");
    std::vector<F_return_type> result;
    result.reserve(local.cols());
    auto global_points = e.Geometry()->Global(local);
    for (long i = 0; i < local.cols(); ++i) {
      result.push_back(f_(global_points.col(i)));
    }
    return result;
  }